

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O3

rfc5444_result oonf_rfc5444_send_if(oonf_rfc5444_target *target,uint8_t msgid)

{
  oonf_rfc5444_protocol *poVar1;
  char cVar2;
  rfc5444_result rVar3;
  undefined8 uVar4;
  ulong uVar5;
  netaddr_str buf;
  
  rVar3 = RFC5444_OKAY;
  if (target != (oonf_rfc5444_target *)0x0) {
    cVar2 = oonf_packet_managed_is_active(&target->interface->_socket,(target->dst)._type);
    if (cVar2 != '\0') {
      uVar5 = (ulong)_oonf_rfc5444_subsystem.logging;
      if (((&log_global_mask)[uVar5] & 2) != 0) {
        poVar1 = target->interface->protocol;
        uVar4 = netaddr_to_prefixstring(&buf,&target->dst,0);
        oonf_log(2,uVar5,"src/base/oonf_rfc5444.c",0x192,0,0,
                 "Create message id %d for protocol %s/target %s on interface %s",msgid,poVar1,uVar4
                 ,target->interface);
      }
      uVar4 = 0x10;
      if ((target->dst)._type == '\x02') {
        uVar4 = 4;
      }
      rVar3 = rfc5444_writer_create_message
                        (&target->interface->protocol->writer,msgid,uVar4,_cb_single_target_selector
                         ,target);
    }
  }
  return rVar3;
}

Assistant:

enum rfc5444_result
oonf_rfc5444_send_if(struct oonf_rfc5444_target *target, uint8_t msgid)
{
  uint8_t addr_len;

#ifdef OONF_LOG_INFO
  struct netaddr_str buf;
#endif

  /* check if socket can send data */
  if (!oonf_rfc5444_is_target_active(target)) {
    return RFC5444_OKAY;
  }

  /* create message */
  OONF_INFO(LOG_RFC5444, "Create message id %d for protocol %s/target %s on interface %s", msgid,
    target->interface->protocol->name, netaddr_to_string(&buf, &target->dst), target->interface->name);

  addr_len = netaddr_get_address_family(&target->dst) == AF_INET ? 4 : 16;
  return rfc5444_writer_create_message(
    &target->interface->protocol->writer, msgid, addr_len, _cb_single_target_selector, target);
}